

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

void __thiscall ON_SubDComponentRef::Clear(ON_SubDComponentRef *this)

{
  ON_SubDComponentRef *this_local;
  
  ON_Object::DestroyRuntimeCache((ON_Object *)this,true);
  ON_Object::PurgeUserData((ON_Object *)this);
  ON_SubDRef::Clear(&this->m_subd_ref);
  (this->m_component_ptr).m_ptr = 0;
  this->m_component_index = ON_COMPONENT_INDEX::UnsetComponentIndex;
  this->m_reference_id = 0;
  return;
}

Assistant:

void ON_SubDComponentRef::Clear()
{
  ON_Geometry::DestroyRuntimeCache();
  PurgeUserData();
  m_subd_ref.Clear();
  m_component_ptr = ON_SubDComponentPtr::Null;
  m_component_index = ON_COMPONENT_INDEX::UnsetComponentIndex;
  m_reference_id = 0;
}